

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Off_reader.h
# Opt level: O0

bool __thiscall Gudhi::Off_reader::goto_next_uncomment_line(Off_reader *this,string *uncomment_line)

{
  bool bVar1;
  char *pcVar2;
  sentry local_21;
  string *local_20;
  string *uncomment_line_local;
  Off_reader *this_local;
  
  local_20 = uncomment_line;
  uncomment_line_local = (string *)this;
  do {
    std::istream::sentry::sentry(&local_21,(istream *)this->stream_,false);
    bVar1 = std::istream::sentry::operator_cast_to_bool(&local_21);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)this->stream_,(string *)local_20);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
  } while (*pcVar2 == '#');
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(this->stream_ + *(long *)(*(long *)this->stream_ + -0x18)));
  return bVar1;
}

Assistant:

bool goto_next_uncomment_line(std::string& uncomment_line) {
    do {
      // skip whitespace, including empty lines
      if (!std::ifstream::sentry(stream_)) return false;
      std::getline(stream_, uncomment_line);
    } while (uncomment_line[0] == '#');
    return static_cast<bool>(stream_);
  }